

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenLoad(BinaryenModuleRef module,uint32_t bytes,bool signed_,uint32_t offset,uint32_t align,
            BinaryenType type,BinaryenExpressionRef ptr,char *memoryName)

{
  BinaryenExpressionRef pEVar1;
  Name NVar2;
  
  if (align == 0) {
    align = bytes;
  }
  NVar2 = getMemoryName(module,memoryName);
  pEVar1 = (BinaryenExpressionRef)MixedArena::allocSpace(&module->allocator,0x48,8);
  pEVar1->_id = LoadId;
  pEVar1[1].type.id = 0;
  *(undefined8 *)(pEVar1 + 2) = 0;
  *(undefined1 *)&pEVar1[2].type.id = 0;
  *(char *)&pEVar1[1]._id = (char)bytes;
  *(bool *)((long)&pEVar1[1]._id + 1) = signed_;
  pEVar1[1].type.id = (ulong)offset;
  *(ulong *)(pEVar1 + 2) = (ulong)align;
  *(BinaryenExpressionRef *)(pEVar1 + 3) = ptr;
  (pEVar1->type).id = type;
  *(IString *)&pEVar1[3].type = NVar2.super_IString.str;
  return pEVar1;
}

Assistant:

BinaryenExpressionRef BinaryenLoad(BinaryenModuleRef module,
                                   uint32_t bytes,
                                   bool signed_,
                                   uint32_t offset,
                                   uint32_t align,
                                   BinaryenType type,
                                   BinaryenExpressionRef ptr,
                                   const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeLoad(bytes,
                !!signed_,
                offset,
                align ? align : bytes,
                (Expression*)ptr,
                Type(type),
                getMemoryName(module, memoryName)));
}